

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall SQStringTable::Remove(SQStringTable *this,SQString *bs)

{
  SQString *p;
  long lVar1;
  SQString *pSVar2;
  SQString **ppSVar3;
  
  pSVar2 = (SQString *)0x0;
  ppSVar3 = this->_strings + (this->_numofslots - 1 & bs->_hash);
  while( true ) {
    p = *ppSVar3;
    if (p == (SQString *)0x0) {
      return;
    }
    if (p == bs) break;
    ppSVar3 = &p->_next;
    pSVar2 = p;
  }
  ppSVar3 = &pSVar2->_next;
  if (pSVar2 == (SQString *)0x0) {
    ppSVar3 = this->_strings + (this->_numofslots - 1 & bs->_hash);
  }
  *ppSVar3 = p->_next;
  this->_slotused = this->_slotused - 1;
  lVar1 = p->_len;
  (**(p->super_SQRefCounted)._vptr_SQRefCounted)(p);
  sq_vm_free(p,lVar1 + 0x40);
  return;
}

Assistant:

void SQStringTable::Remove(SQString *bs)
{
    SQString *s;
    SQString *prev=NULL;
    SQHash h = bs->_hash&(_numofslots - 1);

    for (s = _strings[h]; s; ){
        if(s == bs){
            if(prev)
                prev->_next = s->_next;
            else
                _strings[h] = s->_next;
            _slotused--;
            SQInteger slen = s->_len;
            s->~SQString();
            SQ_FREE(s,sizeof(SQString) + sq_rsl(slen));
            return;
        }
        prev = s;
        s = s->_next;
    }
    assert(0);//if this fail something is wrong
}